

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O0

void __thiscall ncnn::Deconvolution::Deconvolution(Deconvolution *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffd0;
  
  Layer::Layer(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__Deconvolution_001f3da8;
  Mat::Mat((Mat *)(in_RDI + 0x20));
  Mat::Mat((Mat *)(in_RDI + 0x28));
  Mat::Mat((Mat *)(in_RDI + 0x30));
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

Deconvolution::Deconvolution()
{
    one_blob_only = true;
    support_inplace = false;
}